

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusBar.cpp
# Opt level: O0

void __thiscall StatusBar::drawSelf(StatusBar *this,PixelGameEngine *pge)

{
  vi2d vVar1;
  int32_t iVar2;
  float *pfVar3;
  v2d_generic<float> local_b4;
  float local_ac;
  float local_a8;
  anon_union_4_2_12391da5_for_Pixel_0 local_a4;
  undefined1 local_a0 [16];
  v2d_generic<float> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  v2d_generic<float> local_34;
  anon_union_4_2_12391da5_for_Pixel_0 local_2c;
  v2d_generic<float> local_28;
  v2d_generic<float> local_20;
  vi2d local_18;
  PixelGameEngine *pge_local;
  StatusBar *this_local;
  
  local_18 = (vi2d)pge;
  pge_local = (PixelGameEngine *)this;
  iVar2 = olc::PixelGameEngine::ScreenWidth(pge);
  olc::v2d_generic<float>::v2d_generic(&local_20,(float)(iVar2 / 2) + -18.0,4.0);
  olc::v2d_generic<float>::v2d_generic(&local_28,36.0,12.0);
  local_2c.n = olc::BLUE.n;
  olc::PixelGameEngine::FillRectDecal(pge,&local_20,&local_28,(Pixel)olc::BLUE.field_1);
  vVar1 = local_18;
  iVar2 = olc::PixelGameEngine::ScreenWidth((PixelGameEngine *)local_18);
  olc::v2d_generic<float>::v2d_generic(&local_34,(float)(iVar2 / 2) + -16.0,6.0);
  std::__cxx11::to_string(&local_78,this->progress / 1000);
  std::operator+(&local_58,&local_78,"%");
  local_88._M_allocated_capacity._0_4_ = olc::WHITE;
  olc::v2d_generic<float>::v2d_generic(&local_90,1.0,1.0);
  olc::PixelGameEngine::DrawStringDecal
            ((PixelGameEngine *)vVar1,&local_34,&local_58,
             (Pixel)local_88._M_allocated_capacity._0_4_,&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  vVar1 = local_18;
  iVar2 = olc::PixelGameEngine::ScreenWidth((PixelGameEngine *)local_18);
  olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_a0,(string *)local_18);
  olc::v2d_generic<float>::v2d_generic
            ((v2d_generic<float> *)(local_a0 + 8),
             (float)iVar2 / 2.0 - (float)((int)local_a0._0_4_ / 2),30.0);
  local_a8 = 1.0;
  local_ac = 0.0;
  pfVar3 = std::max<float>(&local_ac,&this->visibilityAmount);
  pfVar3 = std::min<float>(&local_a8,pfVar3);
  local_a4.field_1 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
       olc::PixelF(1.0,0.0,0.0,*pfVar3);
  olc::v2d_generic<float>::v2d_generic(&local_b4,1.0,1.0);
  olc::PixelGameEngine::DrawStringDecal
            ((PixelGameEngine *)vVar1,(vf2d *)(local_a0 + 8),&this->currentJoke,
             (Pixel)local_a4.field_1,&local_b4);
  return;
}

Assistant:

void StatusBar::drawSelf(olc::PixelGameEngine *pge) const {
    pge->FillRectDecal({pge->ScreenWidth() / 2 - 18.0f, 4}, {36, 12}, olc::BLUE);
    pge->DrawStringDecal({pge->ScreenWidth() / 2 - 16.0f, 6}, std::to_string(progress / 1000) + "%");
    pge->DrawStringDecal(
	    {pge->ScreenWidth() / 2.0f - pge->GetTextSize(currentJoke).x / 2, 30},
	    currentJoke,
	    olc::PixelF(1.0f, 0.0f, 0.0f, std::min(1.0f, std::max(0.0f, visibilityAmount)))
	    );
}